

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableRequiresCommand.cxx
# Opt level: O3

bool __thiscall
cmVariableRequiresCommand::InitialPass
          (cmVariableRequiresCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  pointer pbVar8;
  string *psVar9;
  ulong uVar10;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string notSet;
  string local_b0;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string *local_50;
  cmState *local_48;
  ulong local_40;
  pointer local_38;
  
  psVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar9;
  if (local_40 < 0x41) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    goto LAB_001ed7cd;
  }
  bVar2 = cmMakefile::IsOn((this->super_cmCommand).Makefile,psVar9);
  if (!bVar2) goto LAB_001ed7cd;
  local_38 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_48 = cmMakefile::GetState((this->super_cmCommand).Makefile);
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar2 = true;
  local_50 = psVar9;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x41) {
    bVar4 = 0;
  }
  else {
    bVar4 = 0;
    uVar7 = 2;
    uVar10 = 3;
    do {
      bVar3 = cmMakefile::IsOn((this->super_cmCommand).Makefile,pbVar8 + uVar7);
      if (!bVar3) {
        std::__cxx11::string::_M_append
                  ((char *)&local_70,
                   (ulong)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_70);
        pcVar5 = cmState::GetCacheEntryValue
                           (local_48,(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + uVar7);
        if (pcVar5 != (char *)0x0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ADVANCED","");
          bVar2 = cmState::GetCacheEntryPropertyAsBool(local_48,pbVar8 + uVar7,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          bVar4 = bVar4 | bVar2;
        }
        bVar2 = false;
      }
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar3 = uVar10 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5
                              );
      uVar7 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar3);
  }
  psVar9 = local_38 + 1;
  pcVar5 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,psVar9);
  if (pcVar5 == (char *)0x0) {
LAB_001ed661:
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,psVar9,bVar2);
    if (bVar2 == false) {
LAB_001ed67c:
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Variable assertion failed:\n","");
      pcVar1 = (local_50->_M_dataplus)._M_p;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar1,pcVar1 + local_50->_M_string_length);
      std::__cxx11::string::append((char *)local_90);
      std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90[0]);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_b0);
      pcVar1 = (local_50->_M_dataplus)._M_p;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar1,pcVar1 + local_50->_M_string_length);
      std::__cxx11::string::append((char *)local_90);
      std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90[0]);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      if (bVar4 != 0) {
        std::__cxx11::string::append((char *)&local_b0);
      }
      cmSystemTools::Error(&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else if (bVar2 == false) {
    this_00 = (this->super_cmCommand).Makefile;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar5,pcVar5 + sVar6);
    bVar2 = cmMakefile::IsOn(this_00,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      bVar2 = false;
      goto LAB_001ed661;
    }
    goto LAB_001ed67c;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
LAB_001ed7cd:
  return 0x40 < local_40;
}

Assistant:

bool cmVariableRequiresCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& testVariable = args[0];
  if (!this->Makefile->IsOn(testVariable)) {
    return true;
  }
  std::string const& resultVariable = args[1];
  bool requirementsMet = true;
  std::string notSet;
  bool hasAdvanced = false;
  cmState* state = this->Makefile->GetState();
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (!this->Makefile->IsOn(args[i])) {
      requirementsMet = false;
      notSet += args[i];
      notSet += "\n";
      if (state->GetCacheEntryValue(args[i]) &&
          state->GetCacheEntryPropertyAsBool(args[i], "ADVANCED")) {
        hasAdvanced = true;
      }
    }
  }
  const char* reqVar = this->Makefile->GetDefinition(resultVariable);
  // if reqVar is unset, then set it to requirementsMet
  // if reqVar is set to true, but requirementsMet is false , then
  // set reqVar to false.
  if (!reqVar || (!requirementsMet && this->Makefile->IsOn(reqVar))) {
    this->Makefile->AddDefinition(resultVariable, requirementsMet);
  }

  if (!requirementsMet) {
    std::string message = "Variable assertion failed:\n";
    message +=
      testVariable + " Requires that the following unset variables are set:\n";
    message += notSet;
    message += "\nPlease set them, or set ";
    message += testVariable + " to false, and re-configure.\n";
    if (hasAdvanced) {
      message +=
        "One or more of the required variables is advanced."
        "  To set the variable, you must turn on advanced mode in cmake.";
    }
    cmSystemTools::Error(message);
  }

  return true;
}